

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *args_2,
          ConfigRuleClauseSyntax *args_3,Token *args_4)

{
  Token topModule;
  Token instance;
  Token semi;
  InstanceConfigRuleSyntax *pIVar1;
  ConfigRuleClauseSyntax *in_RCX;
  undefined8 *in_RDX;
  Info *in_RSI;
  Info *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pIVar1 = (InstanceConfigRuleSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  instance.info = in_R9;
  instance._0_8_ = in_RSI->location;
  topModule.info = (Info *)in_RSI->rawTextPtr;
  topModule._0_8_ = in_RDX[1];
  semi.info = in_RSI;
  semi._0_8_ = in_RDX;
  slang::syntax::InstanceConfigRuleSyntax::InstanceConfigRuleSyntax
            ((InstanceConfigRuleSyntax *)*in_RDX,instance,topModule,
             (SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *)in_R9->location,in_RCX,
             semi);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }